

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,uint32 slotIndex,uint8 dataWidth,
          ViewType viewType,uint32 offset)

{
  bool bVar1;
  uint32 local_13;
  undefined1 local_f;
  ViewType local_e;
  uint8 local_d;
  undefined1 uStack_c;
  OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if (((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) &&
     (local_f = (undefined1)value, value < 0x100)) {
    _uStack_c = offset;
    local_13 = slotIndex;
    local_e = viewType;
    local_d = dataWidth;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_13,0xb,
               &this->super_ByteCodeWriter,false);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmSimdTypedArr(OpCodeAsmJs op, RegSlot value, uint32 slotIndex, uint8 dataWidth, ArrayBufferView::ViewType viewType, uint32 offset)
    {
        OpLayoutT_AsmSimdTypedArr<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::template Assign<ArrayBufferView::ViewType>(layout.ViewType, viewType)
            && SizePolicy::Assign(layout.SlotIndex, slotIndex) && SizePolicy::template Assign<int8>(layout.DataWidth, dataWidth) && SizePolicy::Assign(layout.Offset, offset))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }